

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS
ref_grid_extrude_twod(REF_GRID_conflict *extruded_grid,REF_GRID twod_grid,REF_INT n_planes)

{
  REF_NODE pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  REF_STATUS RVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  REF_CELL pRVar14;
  REF_GLOB n_global;
  REF_GRID pRVar15;
  REF_INT RVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  REF_INT new_cell;
  REF_INT max_faceid;
  REF_INT faceid1;
  REF_INT new_node;
  REF_INT new_nodes [27];
  REF_INT nodes [27];
  uint local_158;
  REF_INT local_154;
  int local_150;
  int local_14c;
  REF_GRID_conflict local_148;
  int local_13c;
  REF_DBL local_138;
  int local_12c;
  ulong local_128;
  REF_GRID local_120;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int local_9c;
  double local_38;
  
  pRVar1 = twod_grid->node;
  *extruded_grid = (REF_GRID_conflict)0x0;
  if (twod_grid->twod == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x3f9,
           "ref_grid_extrude_twod","require twod grid input");
    uVar5 = 1;
  }
  else {
    uVar5 = ref_grid_create(extruded_grid,twod_grid->mpi);
    if (uVar5 == 0) {
      local_148 = *extruded_grid;
      ref_node = local_148->node;
      local_128 = (ulong)(uint)n_planes;
      local_120 = twod_grid;
      if (n_planes < 1) {
        n_global = 0;
      }
      else {
        local_38 = (double)(n_planes + -1);
        iVar6 = 0;
        n_global = 0;
        do {
          local_150 = iVar6;
          if (0 < pRVar1->max) {
            local_138 = (double)iVar6 / local_38;
            lVar18 = 1;
            lVar13 = 0;
            do {
              if (-1 < pRVar1->global[lVar13]) {
                uVar5 = ref_node_add(ref_node,pRVar1->global[lVar13] + n_global,&local_12c);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,0x405,"ref_grid_extrude_twod",(ulong)uVar5,"add node in plane");
                  return uVar5;
                }
                ref_node->part[local_12c] = pRVar1->part[lVar13];
                pRVar2 = pRVar1->real;
                pRVar3 = ref_node->real;
                lVar11 = (long)local_12c;
                pRVar3[lVar11 * 0xf] = pRVar2[lVar18 + -1];
                pRVar3[lVar11 * 0xf + 1] = local_138;
                pRVar3[lVar11 * 0xf + 2] = pRVar2[lVar18];
              }
              lVar13 = lVar13 + 1;
              lVar18 = lVar18 + 0xf;
            } while (lVar13 < pRVar1->max);
          }
          n_global = n_global + pRVar1->old_n_global;
          iVar6 = local_150 + 1;
          n_planes = (REF_INT)local_128;
        } while (iVar6 != n_planes);
      }
      uVar5 = ref_node_initialize_n_global(ref_node,n_global);
      if (uVar5 == 0) {
        pRVar14 = local_120->cell[0];
        if (0 < pRVar14->max) {
          iVar6 = n_planes + -1;
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          local_138 = (REF_DBL)CONCAT44(local_138._4_4_,iVar6);
          RVar16 = 0;
          local_158 = 0;
          do {
            pRVar15 = local_120;
            RVar7 = ref_cell_nodes(pRVar14,RVar16,&local_a8);
            if (RVar7 == 0) {
              uVar8 = ref_grid_orient_edg(pRVar15,&local_a8);
              uVar5 = local_158;
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0x412,"ref_grid_extrude_twod",(ulong)uVar8,"orient_edge");
                uVar5 = uVar8;
              }
              iVar10 = iStack_a4;
              iVar6 = local_a8;
              iVar17 = 0;
              local_150 = RVar16;
              if (uVar8 == 0) {
                do {
                  bVar19 = local_138._0_4_ == iVar17;
                  local_158 = uVar5;
                  if (bVar19) goto LAB_0015274b;
                  iStack_114 = pRVar1->n * iVar17;
                  iVar17 = iVar17 + 1;
                  iStack_10c = pRVar1->n * iVar17;
                  local_118 = iStack_114 + iVar10;
                  iStack_114 = iStack_114 + iVar6;
                  iStack_110 = iStack_10c + iVar6;
                  iStack_10c = iStack_10c + iVar10;
                  local_108 = iStack_a0;
                  local_158 = ref_cell_add(local_148->cell[6],&local_118,&local_154);
                } while (local_158 == 0);
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0x41e,"ref_grid_extrude_twod",(ulong)local_158,"boundary");
              }
              else {
                bVar19 = false;
                local_158 = uVar5;
              }
LAB_0015274b:
              RVar16 = local_150;
              if (!bVar19) {
                return local_158;
              }
            }
            RVar16 = RVar16 + 1;
            pRVar14 = local_120->cell[0];
          } while (RVar16 < pRVar14->max);
        }
        pRVar15 = local_120;
        uVar4 = local_128;
        local_14c = -0x80000000;
        pRVar14 = local_120->cell[0];
        if (0 < pRVar14->max) {
          iVar6 = 0;
          do {
            RVar7 = ref_cell_nodes(pRVar14,iVar6,&local_a8);
            iVar10 = local_14c;
            if ((RVar7 == 0) && (iVar10 = iStack_a0, iStack_a0 < local_14c)) {
              iVar10 = local_14c;
            }
            local_14c = iVar10;
            iVar6 = iVar6 + 1;
            pRVar14 = pRVar15->cell[0];
          } while (iVar6 < pRVar14->max);
        }
        local_13c = local_14c;
        uVar5 = ref_mpi_max(pRVar15->mpi,&local_13c,&local_14c,1);
        if (uVar5 == 0) {
          uVar5 = ref_mpi_bcast(pRVar15->mpi,&local_14c,1,1);
          if (uVar5 == 0) {
            local_13c = local_14c + 1;
            local_138 = (REF_DBL)(ulong)(local_14c + 2);
            uVar5 = (int)uVar4 - 1;
            local_128 = (ulong)uVar5;
            pRVar14 = pRVar15->cell[3];
            if (0 < pRVar14->max) {
              local_150 = pRVar1->n * uVar5;
              uVar8 = 0;
              if (0 < (int)uVar5) {
                uVar8 = uVar5;
              }
              RVar16 = 0;
              do {
                RVar7 = ref_cell_nodes(pRVar14,RVar16,&local_a8);
                if (RVar7 == 0) {
                  local_118 = local_a8;
                  iStack_10c = local_13c;
                  uVar5 = ref_cell_add(local_148->cell[3],&local_118,&local_154);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x435,"ref_grid_extrude_twod",(ulong)uVar5,"boundary");
                    return uVar5;
                  }
                  local_118 = local_a8 + local_150;
                  iStack_114 = iStack_a0 + local_150;
                  iStack_110 = iStack_a4 + local_150;
                  iStack_10c = SUB84(local_138,0);
                  uVar5 = ref_cell_add(local_148->cell[3],&local_118,&local_154);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x43a,"ref_grid_extrude_twod",(ulong)uVar5,"boundary");
                    return uVar5;
                  }
                  uVar5 = 0;
                  while (pRVar15 = local_120, uVar8 != uVar5) {
                    iStack_110 = pRVar1->n * uVar5;
                    uVar5 = uVar5 + 1;
                    local_104 = pRVar1->n * uVar5;
                    local_118 = local_a8 + iStack_110;
                    iStack_114 = iStack_a4 + iStack_110;
                    iStack_110 = iStack_110 + iStack_a0;
                    iStack_10c = local_a8 + local_104;
                    local_108 = iStack_a4 + local_104;
                    local_104 = local_104 + iStack_a0;
                    uVar9 = ref_cell_add(local_148->cell[10],&local_118,&local_154);
                    if (uVar9 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                             ,0x445,"ref_grid_extrude_twod",(ulong)uVar9,"interior");
                      return uVar9;
                    }
                  }
                }
                RVar16 = RVar16 + 1;
                pRVar14 = pRVar15->cell[3];
              } while (RVar16 < pRVar14->max);
            }
            pRVar14 = pRVar15->cell[6];
            if (pRVar14->max < 1) {
              uVar5 = 0;
            }
            else {
              iVar6 = (int)local_128;
              iVar10 = pRVar1->n * iVar6;
              if (iVar6 < 1) {
                iVar6 = 0;
              }
              iVar17 = 0;
              do {
                RVar7 = ref_cell_nodes(pRVar14,iVar17,&local_a8);
                if (RVar7 == 0) {
                  local_108 = local_13c;
                  uVar5 = ref_cell_add(local_148->cell[6],&local_118,&local_154);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x450,"ref_grid_extrude_twod",(ulong)uVar5,"boundary");
                    return uVar5;
                  }
                  local_118 = local_a8 + iVar10;
                  iStack_114 = iStack_a4 + iVar10;
                  iStack_110 = iStack_a0 + iVar10;
                  iStack_10c = local_9c + iVar10;
                  local_108 = SUB84(local_138,0);
                  uVar5 = ref_cell_add(local_148->cell[6],&local_118,&local_154);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x456,"ref_grid_extrude_twod",(ulong)uVar5,"boundary");
                    return uVar5;
                  }
                  iVar12 = 0;
                  while (iVar6 != iVar12) {
                    iStack_10c = pRVar1->n * iVar12;
                    iVar12 = iVar12 + 1;
                    local_fc = pRVar1->n * iVar12;
                    local_118 = local_a8 + iStack_10c;
                    iStack_114 = iStack_a4 + iStack_10c;
                    iStack_110 = iStack_a0 + iStack_10c;
                    iStack_10c = iStack_10c + local_9c;
                    local_108 = local_a8 + local_fc;
                    local_104 = iStack_a4 + local_fc;
                    local_100 = iStack_a0 + local_fc;
                    local_fc = local_fc + local_9c;
                    uVar5 = ref_cell_add(local_148->cell[0xb],&local_118,&local_154);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                             ,0x463,"ref_grid_extrude_twod",(ulong)uVar5,"boundary");
                      return uVar5;
                    }
                  }
                }
                iVar17 = iVar17 + 1;
                pRVar14 = local_120->cell[6];
                uVar5 = 0;
              } while (iVar17 < pRVar14->max);
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x42b,"ref_grid_extrude_twod",(ulong)uVar5,"share max faceid");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x429,"ref_grid_extrude_twod",(ulong)uVar5,"max faceid");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x40d,"ref_grid_extrude_twod",(ulong)uVar5,"init glob");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x3fa,
             "ref_grid_extrude_twod",(ulong)uVar5,"create grid");
    }
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_grid_extrude_twod(REF_GRID *extruded_grid,
                                         REF_GRID twod_grid, REF_INT n_planes) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_NODE twod_node = ref_grid_node(twod_grid);
  REF_INT plane, node, new_node;
  REF_INT offset, offset0, offset1;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, new_cell;
  REF_INT max_faceid, faceid1, faceid2;
  REF_GLOB global_offset;
  REF_DBL y;
  *extruded_grid = NULL;
  RAS(ref_grid_twod(twod_grid), "require twod grid input");
  RSS(ref_grid_create(extruded_grid, ref_grid_mpi(twod_grid)), "create grid");
  ref_grid = *extruded_grid;
  ref_node = ref_grid_node(ref_grid);

  global_offset = 0;
  for (plane = 0; plane < n_planes; plane++) {
    y = (REF_DBL)plane / (REF_DBL)(n_planes - 1);
    each_ref_node_valid_node(twod_node, node) {
      RSS(ref_node_add(ref_node,
                       ref_node_global(twod_node, node) + global_offset,
                       &new_node),
          "add node in plane");
      ref_node_part(ref_node, new_node) = ref_node_part(twod_node, node);
      ref_node_xyz(ref_node, 0, new_node) = ref_node_xyz(twod_node, 0, node);
      ref_node_xyz(ref_node, 1, new_node) = y;
      ref_node_xyz(ref_node, 2, new_node) = ref_node_xyz(twod_node, 1, node);
    }
    global_offset += ref_node_n_global(twod_node);
  }
  RSS(ref_node_initialize_n_global(ref_node, global_offset), "init glob");

  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(twod_grid), cell, nodes) {
    REF_INT node0, node1;
    /* use triangle to orient edge correctly */
    RSS(ref_grid_orient_edg(twod_grid, nodes), "orient_edge");
    node0 = nodes[0];
    node1 = nodes[1];
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = node1 + offset0;
      new_nodes[1] = node0 + offset0;
      new_nodes[2] = node0 + offset1;
      new_nodes[3] = node1 + offset1;
      new_nodes[4] = nodes[2];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell),
          "boundary");
    }
  }

  /* find two unused faceids for the symmetry planes */
  max_faceid = REF_INT_MIN;
  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(twod_grid), cell, nodes) {
    max_faceid = MAX(max_faceid, nodes[2]);
  }
  faceid1 = max_faceid;
  RSS(ref_mpi_max(ref_grid_mpi(twod_grid), &faceid1, &max_faceid, REF_INT_TYPE),
      "max faceid");
  RSS(ref_mpi_bcast(ref_grid_mpi(twod_grid), &max_faceid, 1, REF_INT_TYPE),
      "share max faceid");
  faceid1 = max_faceid + 1;
  faceid2 = max_faceid + 2;

  offset = (n_planes - 1) * ref_node_n(twod_node);
  each_ref_cell_valid_cell_with_nodes(ref_grid_tri(twod_grid), cell, nodes) {
    new_nodes[0] = nodes[0];
    new_nodes[1] = nodes[1];
    new_nodes[2] = nodes[2];
    new_nodes[3] = faceid1;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell), "boundary");
    new_nodes[0] = nodes[0] + offset;
    new_nodes[1] = nodes[2] + offset;
    new_nodes[2] = nodes[1] + offset;
    new_nodes[3] = faceid2;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell), "boundary");
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = nodes[0] + offset0;
      new_nodes[1] = nodes[1] + offset0;
      new_nodes[2] = nodes[2] + offset0;
      new_nodes[3] = nodes[0] + offset1;
      new_nodes[4] = nodes[1] + offset1;
      new_nodes[5] = nodes[2] + offset1;
      RSS(ref_cell_add(ref_grid_pri(ref_grid), new_nodes, &new_cell),
          "interior");
    }
  }

  offset = (n_planes - 1) * ref_node_n(twod_node);
  each_ref_cell_valid_cell_with_nodes(ref_grid_qua(twod_grid), cell, nodes) {
    new_nodes[0] = nodes[3];
    new_nodes[1] = nodes[2];
    new_nodes[2] = nodes[1];
    new_nodes[3] = nodes[0];
    new_nodes[4] = faceid1;
    RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell), "boundary");
    new_nodes[0] = nodes[0] + offset;
    new_nodes[1] = nodes[1] + offset;
    new_nodes[2] = nodes[2] + offset;
    new_nodes[3] = nodes[3] + offset;
    new_nodes[4] = faceid2;
    RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell), "boundary");
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = nodes[0] + offset0;
      new_nodes[1] = nodes[1] + offset0;
      new_nodes[2] = nodes[2] + offset0;
      new_nodes[3] = nodes[3] + offset0;
      new_nodes[4] = nodes[0] + offset1;
      new_nodes[5] = nodes[1] + offset1;
      new_nodes[6] = nodes[2] + offset1;
      new_nodes[7] = nodes[3] + offset1;
      RSS(ref_cell_add(ref_grid_hex(ref_grid), new_nodes, &new_cell),
          "boundary");
    }
  }

  return REF_SUCCESS;
}